

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::checkStageIO(TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit)

{
  int iVar1;
  EShLanguage unitStage;
  TIntermAggregate *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar3;
  iterator iVar4;
  size_type sVar5;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_b0 [2];
  TIntermNode **local_a0;
  TIntermNode **local_98;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_90;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  unitEnd;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_68;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  end;
  TIntermSequence unitLinkerObjects;
  TIntermSequence linkerObjects;
  TIntermediate *unit_local;
  TInfoSink *infoSink_local;
  TIntermediate *this_local;
  
  if ((unit->treeRoot != (TIntermNode *)0x0) && (this->treeRoot != (TIntermNode *)0x0)) {
    pTVar2 = findLinkerObjects(this);
    iVar1 = (*(pTVar2->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])();
    TVector<TIntermNode_*>::TVector
              ((TVector<TIntermNode_*> *)
               &unitLinkerObjects.
                super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (TVector<TIntermNode_*> *)CONCAT44(extraout_var,iVar1));
    pTVar2 = findLinkerObjects(unit);
    iVar1 = (*(pTVar2->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])();
    TVector<TIntermNode_*>::TVector
              ((TVector<TIntermNode_*> *)&end,
               (TVector<TIntermNode_*> *)CONCAT44(extraout_var_00,iVar1));
    iVar3 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                      ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                       &unitLinkerObjects.
                        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                      ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                       &unitLinkerObjects.
                        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_68 = std::
               remove_if<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__0>
                         (iVar3._M_current,iVar4._M_current);
    unitEnd._M_current =
         (TIntermNode **)
         std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                   ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                    &unitLinkerObjects.
                     super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                     super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar5 = __gnu_cxx::operator-(&local_68,&unitEnd);
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::resize
              ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
               &unitLinkerObjects.
                super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,sVar5);
    local_98 = (TIntermNode **)
               std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                         ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)&end);
    local_a0 = (TIntermNode **)
               std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                         ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)&end);
    local_90 = std::
               remove_if<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,glslang::TIntermediate::checkStageIO(TInfoSink&,glslang::TIntermediate&)::__1>
                         (local_98,local_a0);
    local_b0[0]._M_current =
         (TIntermNode **)
         std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                   ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)&end);
    sVar5 = __gnu_cxx::operator-(&local_90,local_b0);
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::resize
              ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)&end,sVar5);
    unitStage = getStage(unit);
    mergeLinkerObjects(this,infoSink,
                       (TIntermSequence *)
                       &unitLinkerObjects.
                        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(TIntermSequence *)&end,
                       unitStage);
    TVector<TIntermNode_*>::~TVector((TVector<TIntermNode_*> *)&end);
    TVector<TIntermNode_*>::~TVector
              ((TVector<TIntermNode_*> *)
               &unitLinkerObjects.
                super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void TIntermediate::checkStageIO(TInfoSink& infoSink, TIntermediate& unit) {
    if (unit.treeRoot == nullptr || treeRoot == nullptr)
        return;

    // Get copies of the linker-object lists
    TIntermSequence linkerObjects = findLinkerObjects()->getSequence();
    TIntermSequence unitLinkerObjects = unit.findLinkerObjects()->getSequence();

    // filter linkerObjects to only contain out variables
    auto end = std::remove_if(linkerObjects.begin(), linkerObjects.end(),
        [](TIntermNode* node) {return node->getAsSymbolNode()->getQualifier().storage != EvqVaryingOut; });
    linkerObjects.resize(end - linkerObjects.begin());

    // filter unitLinkerObjects to only contain in variables
    auto unitEnd = std::remove_if(unitLinkerObjects.begin(), unitLinkerObjects.end(),
        [](TIntermNode* node) {return node->getAsSymbolNode()->getQualifier().storage != EvqVaryingIn; });
    unitLinkerObjects.resize(unitEnd - unitLinkerObjects.begin());

    // do matching and error checking
    mergeLinkerObjects(infoSink, linkerObjects, unitLinkerObjects, unit.getStage());

    // TODO: final check; make sure that any statically used `in` have matching `out` written to
}